

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O0

Offset<reflection::Enum> __thiscall reflection::EnumBuilder::Finish(EnumBuilder *this)

{
  uoffset_t _o;
  uoffset_t end;
  EnumBuilder *this_local;
  Offset<reflection::Enum> o;
  
  _o = flatbuffers::FlatBufferBuilderImpl<false>::EndTable(this->fbb_,this->start_);
  flatbuffers::Offset<reflection::Enum>::Offset
            ((Offset<reflection::Enum> *)((long)&this_local + 4),_o);
  flatbuffers::FlatBufferBuilderImpl<false>::Required<reflection::Enum>
            (this->fbb_,this_local._4_4_,4);
  flatbuffers::FlatBufferBuilderImpl<false>::Required<reflection::Enum>
            (this->fbb_,this_local._4_4_,6);
  flatbuffers::FlatBufferBuilderImpl<false>::Required<reflection::Enum>
            (this->fbb_,this_local._4_4_,10);
  return (Offset<reflection::Enum>)this_local._4_4_;
}

Assistant:

::flatbuffers::Offset<Enum> Finish() {
    const auto end = fbb_.EndTable(start_);
    auto o = ::flatbuffers::Offset<Enum>(end);
    fbb_.Required(o, Enum::VT_NAME);
    fbb_.Required(o, Enum::VT_VALUES);
    fbb_.Required(o, Enum::VT_UNDERLYING_TYPE);
    return o;
  }